

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

Vec_Int_t * Abc_FrameDeriveStatusArray(Vec_Ptr_t *vCexes)

{
  int iVar1;
  void *pvVar2;
  undefined4 local_2c;
  int i;
  Abc_Cex_t *pCex;
  Vec_Int_t *vStatuses;
  Vec_Ptr_t *vCexes_local;
  
  if (vCexes == (Vec_Ptr_t *)0x0) {
    vCexes_local = (Vec_Ptr_t *)0x0;
  }
  else {
    iVar1 = Vec_PtrSize(vCexes);
    vCexes_local = (Vec_Ptr_t *)Vec_IntAlloc(iVar1);
    iVar1 = Vec_PtrSize(vCexes);
    Vec_IntFill((Vec_Int_t *)vCexes_local,iVar1,-1);
    for (local_2c = 0; iVar1 = Vec_PtrSize(vCexes), local_2c < iVar1; local_2c = local_2c + 1) {
      pvVar2 = Vec_PtrEntry(vCexes,local_2c);
      if (pvVar2 != (void *)0x0) {
        Vec_IntWriteEntry((Vec_Int_t *)vCexes_local,local_2c,0);
      }
    }
  }
  return (Vec_Int_t *)vCexes_local;
}

Assistant:

Vec_Int_t * Abc_FrameDeriveStatusArray( Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vStatuses;
    Abc_Cex_t * pCex;
    int i;
    if ( vCexes == NULL )
        return NULL;
    vStatuses = Vec_IntAlloc( Vec_PtrSize(vCexes) );
    Vec_IntFill( vStatuses, Vec_PtrSize(vCexes), -1 ); // assume UNDEC
    Vec_PtrForEachEntry( Abc_Cex_t *, vCexes, pCex, i )
        if ( pCex != NULL )
            Vec_IntWriteEntry( vStatuses, i, 0 ); // set this output as SAT
    return vStatuses;    
}